

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double erlang_cdf_inv(double cdf,double a,double b,int c)

{
  double x;
  double dVar1;
  double dVar2;
  int iVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar4;
  undefined1 local_58 [16];
  double local_30;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    if ((cdf != 0.0) || (dVar2 = a, NAN(cdf))) {
      if ((cdf != 1.0) || (NAN(cdf))) {
        x = a + 1.0;
        while (dVar2 = erlang_cdf(x,a,b,c), dVar2 <= cdf) {
          x = (x - a) + (x - a) + a;
        }
        local_58 = ZEXT816(0);
        iVar3 = 0;
        local_30 = a;
        while( true ) {
          dVar4 = x;
          iVar3 = iVar3 + 1;
          dVar2 = (local_30 + dVar4) * 0.5;
          dVar1 = erlang_cdf(dVar2,a,b,c);
          if (ABS(dVar1 - cdf) < 0.0001) break;
          if (iVar3 == 0x65) {
            std::operator<<((ostream *)&std::cout," \n");
            std::operator<<((ostream *)&std::cout,"ERLANG_CDF_INV - Warning!\n");
            std::operator<<((ostream *)&std::cout,"  Iteration limit exceeded.\n");
            return 0.0;
          }
          if ((double)local_58._0_8_ <= cdf && dVar1 <= cdf) {
            local_58._8_4_ = extraout_XMM0_Dc;
            local_58._0_8_ = dVar1;
            local_58._12_4_ = extraout_XMM0_Dd;
            x = dVar4;
            local_30 = dVar2;
          }
          else {
            x = dVar2;
            if (cdf <= dVar1 && cdf <= (double)local_58._0_8_) {
              local_58._8_4_ = extraout_XMM0_Dc;
              local_58._0_8_ = dVar1;
              local_58._12_4_ = extraout_XMM0_Dd;
              x = dVar4;
              local_30 = dVar2;
            }
          }
        }
      }
      else {
        dVar2 = 1e+30;
      }
    }
    return dVar2;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"ERLANG_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double erlang_cdf_inv ( double cdf, double a, double b, int c )

//****************************************************************************80
//
//  Purpose:
//
//    ERLANG_CDF_INV inverts the Erlang CDF.
//
//  Discussion:
//
//    A simple bisection method is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, int C, the parameters of the PDF.
//    0.0 < B.
//    0 < C.
//
//    Output, double ERLANG_CDF_INV, the corresponding argument of the CDF.
//
{
  double cdf1;
  double cdf2;
  double cdf3;
  int it;
  int it_max = 100;
  const double r8_huge = 1.0E+30;
  double tol = 0.0001;
  double x;
  double x1;
  double x2;
  double x3;

  x = 0.0;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "ERLANG_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf == 0.0 )
  {
    x = a;
    return x;
  }
  else if ( 1.0 == cdf )
  {
    x = r8_huge;
    return x;
  }

  x1 = a;
  cdf1 = 0.0;

  x2 = a + 1.0;

  for ( ; ; )
  {
    cdf2 = erlang_cdf ( x2, a, b, c );

    if ( cdf < cdf2 )
    {
      break;
    }
    x2 = a + 2.0 * ( x2 - a );
  }
//
//  Now use bisection.
//
  it = 0;

  for ( ; ; )
  {
    it = it + 1;

    x3 = 0.5 * ( x1 + x2 );
    cdf3 = erlang_cdf ( x3, a, b, c );

    if ( fabs ( cdf3 - cdf ) < tol )
    {
      x = x3;
      break;
    }

    if ( it_max < it )
    {
      cout << " \n";
      cout << "ERLANG_CDF_INV - Warning!\n";
      cout << "  Iteration limit exceeded.\n";
      return x;
    }

    if ( ( cdf3 <= cdf && cdf1 <= cdf ) || ( cdf <= cdf3 && cdf <= cdf1 ) )
    {
      x1 = x3;
      cdf1 = cdf3;
    }
    else
    {
      x2 = x3;
      cdf2 = cdf3;
    }
  }
  return x;
}